

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O2

bool __thiscall FDrawInfo::DoFakeCeilingBridge(FDrawInfo *this,subsector_t *subsec,float Planez)

{
  long *plVar1;
  double dVar2;
  seg_t *psVar3;
  subsector_t *subsec_00;
  bool bVar4;
  ulong uVar5;
  sector_t *psVar6;
  long lVar7;
  DWORD i;
  ulong uVar8;
  subsector_t *subsec_local;
  
  uVar5 = (ulong)subsec->numlines;
  lVar7 = 0;
  while (uVar5 * 0x48 + 0x48 != lVar7 + 0x48) {
    if ((*(long *)((long)&subsec->firstline->backsector + lVar7) == 0) ||
       (plVar1 = (long *)((long)&subsec->firstline->PartnerSeg + lVar7), lVar7 = lVar7 + 0x48,
       *plVar1 == 0)) {
      return false;
    }
  }
  lVar7 = 0x30;
  uVar8 = 0;
  subsec_local = subsec;
  do {
    if (uVar5 <= uVar8) {
      TArray<subsector_t_*,_subsector_t_*>::Push(&this->HandledSubsectors,&subsec_local);
      return true;
    }
    psVar3 = subsec->firstline;
    subsec_00 = *(subsector_t **)(*(long *)((long)&psVar3->v1 + lVar7) + 0x38);
    if (subsec_00->validcount != validcount) {
      subsec_00->validcount = validcount;
      psVar6 = *(sector_t **)((long)psVar3 + lVar7 + -8);
      if ((*(sector_t **)((long)psVar3 + lVar7 + -0x10) != psVar6) &&
         (*(long *)((long)psVar3 + lVar7 + -0x18) != 0)) {
        psVar6 = gl_FakeFlat(psVar6,&fakesec,true);
        if ((psVar6->ceilingplane).normal.Y != 0.0 || (psVar6->ceilingplane).normal.X != 0.0) {
          return false;
        }
        dVar2 = psVar6->planes[1].TexZ;
        if ((double)Planez < dVar2) {
          return false;
        }
        if (dVar2 == (double)Planez) goto LAB_003f50c7;
      }
      bVar4 = DoFakeCeilingBridge(this,subsec_00,Planez);
      if (!bVar4) {
        return false;
      }
    }
LAB_003f50c7:
    uVar8 = uVar8 + 1;
    uVar5 = (ulong)subsec->numlines;
    lVar7 = lVar7 + 0x48;
  } while( true );
}

Assistant:

bool FDrawInfo::DoFakeCeilingBridge(subsector_t * subsec, float Planez)
{
	// Is there a one-sided wall in this sector?
	// Do this first to avoid unnecessary recursion
	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		if (subsec->firstline[i].backsector == NULL) return false;
		if (subsec->firstline[i].PartnerSeg == NULL) return false;
	}

	for (DWORD i = 0; i < subsec->numlines; i++)
	{
		seg_t * seg = subsec->firstline + i;
		subsector_t * backsub = seg->PartnerSeg->Subsector;

		// already checked?
		if (backsub->validcount == validcount) continue;
		backsub->validcount = validcount;

		if (seg->frontsector != seg->backsector && seg->linedef)
		{
			// Note: if this is a real line between sectors
			// we can be sure that render_sector is the real sector!

			sector_t * sec = gl_FakeFlat(seg->backsector, &fakesec, true);

			// Don't bother with slopes
			if (sec->ceilingplane.isSlope())  return false;

			// Is the neighboring ceiling higher than the desired height?
			if (sec->GetPlaneTexZ(sector_t::ceiling) > Planez)
			{
				// todo: check for missing textures.
				return false;
			}

			// This is an exact height match which means we don't have to do any further checks for this sector
			// No texture checks though! 
			if (sec->GetPlaneTexZ(sector_t::ceiling) == Planez) continue;
		}
		if (!DoFakeCeilingBridge(backsub, Planez)) return false;
	}
	// all checked ok. This sector is part of the current fake plane

	HandledSubsectors.Push(subsec);
	return 1;
}